

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

int commit_stack(Parser *p,SNode *sn)

{
  uint32 *puVar1;
  uint uVar2;
  PNode *pn;
  int iVar3;
  PNode *pPVar4;
  ZNode *pZVar5;
  
  iVar3 = -1;
  if ((sn->zns).n == 1) {
    pZVar5 = *(sn->zns).v;
    uVar2 = (pZVar5->sns).n;
    iVar3 = -2;
    if ((uVar2 < 2) &&
       (((pPVar4 = pZVar5->pn, (pPVar4->parse_node).start_loc.s != (pPVar4->parse_node).end ||
         (pPVar4->reduction == (D_Reduction *)0x0)) ||
        (iVar3 = -3, pPVar4->reduction->final_code == (D_ReductionCode)0x0)))) {
      if (uVar2 == 0) {
        iVar3 = 0;
      }
      else {
        iVar3 = commit_stack(p,*(pZVar5->sns).v);
        if (iVar3 < 0) {
          return iVar3;
        }
        pPVar4 = (*(sn->zns).v)->pn;
      }
      pPVar4 = commit_tree(p,pPVar4);
      if (pPVar4 == (PNode *)0x0) {
        iVar3 = -4;
      }
      else {
        pZVar5 = *(sn->zns).v;
        pn = pZVar5->pn;
        if (pPVar4 != pn) {
          pPVar4->refcount = pPVar4->refcount + 1;
          puVar1 = &pn->refcount;
          *puVar1 = *puVar1 - 1;
          if (*puVar1 == 0) {
            free_PNode(p,pn);
            pZVar5 = *(sn->zns).v;
          }
          pZVar5->pn = pPVar4;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int commit_stack(Parser *p, SNode *sn) {
  int res = 0;
  PNode *tpn;

  if (sn->zns.n != 1) return -1;
  if (sn->zns.v[0]->sns.n > 1) return -2;
  if (is_unreduced_epsilon_PNode(sn->zns.v[0]->pn)) /* wait till reduced */
    return -3;
  if (sn->zns.v[0]->sns.n)
    if ((res = commit_stack(p, sn->zns.v[0]->sns.v[0])) < 0) return res;
  tpn = commit_tree(p, sn->zns.v[0]->pn);
  if (!tpn) return -4;
  if (tpn != sn->zns.v[0]->pn) {
    ref_pn(tpn);
    unref_pn(p, sn->zns.v[0]->pn);
    sn->zns.v[0]->pn = tpn;
  }
  return res;
}